

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

complex<float> __thiscall soul::Value::PackedData::getAsComplex32(PackedData *this)

{
  _ComplexT in_RAX;
  
  if ((this->type->primitiveType).type == complex32) {
    if (this->size != 8) {
      throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
    }
  }
  else {
    getAsComplex64(this);
  }
  return (complex<float>)in_RAX;
}

Assistant:

std::complex<float> getAsComplex32() const
    {
        if (type.isComplex32())
            return getAs<std::complex<float>>();

        return static_cast<std::complex<float>> (getAsComplex64());
    }